

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O2

Vec_Int_t * Aig_ManPartitionLevelized(Aig_Man_t *p,int nPartSize)

{
  Vec_Vec_t *p_00;
  Vec_Int_t *p_01;
  Vec_Ptr_t *pVVar1;
  void *pvVar2;
  int i;
  int iVar3;
  int i_00;
  
  p_00 = Aig_ManLevelize(p);
  p_01 = Vec_IntStart(p->vObjs->nSize);
  i = p_00->nSize;
  iVar3 = 0;
  while (0 < i) {
    i = i + -1;
    pVVar1 = Vec_VecEntry(p_00,i);
    i_00 = pVVar1->nSize;
    while (0 < i_00) {
      i_00 = i_00 + -1;
      pVVar1 = Vec_VecEntry(p_00,i);
      pvVar2 = Vec_PtrEntry(pVVar1,i_00);
      Vec_IntWriteEntry(p_01,*(int *)((long)pvVar2 + 0x24),iVar3 / nPartSize);
      iVar3 = iVar3 + 1;
    }
  }
  Vec_VecFree(p_00);
  return p_01;
}

Assistant:

Vec_Int_t * Aig_ManPartitionLevelized( Aig_Man_t * p, int nPartSize )
{
    Vec_Int_t * vId2Part;
    Vec_Vec_t * vNodes;
    Aig_Obj_t * pObj;
    int i, k, Counter = 0;
    vNodes = Aig_ManLevelize( p );
    vId2Part = Vec_IntStart( Aig_ManObjNumMax(p) );
    Vec_VecForEachEntryReverseReverse( Aig_Obj_t *, vNodes, pObj, i, k )
        Vec_IntWriteEntry( vId2Part, Aig_ObjId(pObj), Counter++/nPartSize );
    Vec_VecFree( vNodes );
    return vId2Part;
}